

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O3

Activation * __thiscall
notch::io::PlainTextNetworkReader::getActivation(PlainTextNetworkReader *this,string *tag)

{
  int iVar1;
  undefined1 *puVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)tag);
  if (iVar1 == 0) {
    puVar2 = core::defaultTanh;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)tag);
    if (iVar1 == 0) {
      puVar2 = core::scaledTanh;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)tag);
      if (iVar1 == 0) {
        puVar2 = core::linearActivation;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)tag);
        if (iVar1 == 0) {
          puVar2 = core::ReLU;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)tag);
          puVar2 = (undefined1 *)0x0;
          if (iVar1 == 0) {
            puVar2 = core::leakyReLU;
          }
        }
      }
    }
  }
  return (Activation *)puVar2;
}

Assistant:

const Activation *getActivation(const std::string &tag) {
        if (tag == "tanh") {
            return &defaultTanh;
        } else if (tag == "scaledTanh") {
            return &scaledTanh;
        } else if (tag == "linear") {
            return &linearActivation;
        } else if (tag == "ReLU") {
            return &ReLU;
        } else if (tag == "leakyReLU") {
            return &leakyReLU;
        }  else {
            return nullptr;
        }
    }